

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

Image __thiscall
Renderer::render(Renderer *this,offset_in_Renderer_to_subr func,bool reportProgress)

{
  _Manager_type p_Var1;
  char in_CL;
  undefined7 in_register_00000011;
  undefined8 uVar2;
  int iVar3;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  Image film;
  TaskScheduler local_b8;
  type gfunc;
  
  uVar2._1_7_ = in_register_00000011;
  uVar2._0_1_ = reportProgress;
  Image::Image(&film,this->camera->resx,this->camera->resy);
  gfunc._M_f = func;
  gfunc._8_8_ = uVar2;
  gfunc._M_bound_args.
  super__Tuple_impl<0UL,_Renderer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_Renderer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Renderer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_Renderer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  TaskScheduler::TaskScheduler(&local_b8);
  for (iVar3 = 0; p_Var1 = local_b8.onprogress.super__Function_base._M_manager,
      iVar3 < this->camera->resy; iVar3 = iVar3 + 1) {
    local_d8 = (_Manager_type)0x0;
    p_Stack_d0 = (_Invoker_type)0x0;
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_e8._M_unused._M_object = operator_new(0x20);
    *(int *)local_e8._M_unused._0_8_ = iVar3;
    *(Renderer **)((long)local_e8._M_unused._0_8_ + 8) = this;
    *(Image **)((long)local_e8._M_unused._0_8_ + 0x10) = &film;
    *(type **)((long)local_e8._M_unused._0_8_ + 0x18) = &gfunc;
    p_Stack_d0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:13:13)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:13:13)>
               ::_M_manager;
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&local_b8,
               (value_type *)&local_e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  }
  if (in_CL != '\0') {
    local_e8._M_unused._M_object =
         local_b8.onprogress.super__Function_base._M_functor._M_unused._M_object;
    local_e8._8_8_ = local_b8.onprogress.super__Function_base._M_functor._8_8_;
    local_b8.onprogress.super__Function_base._M_functor._M_unused._M_object = (int *)0x0;
    local_b8.onprogress.super__Function_base._M_functor._8_8_ = 0;
    local_b8.onprogress.super__Function_base._M_manager =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:22:22)>
         ::_M_manager;
    local_d8 = p_Var1;
    p_Stack_d0 = local_b8.onprogress._M_invoker;
    local_b8.onprogress._M_invoker =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:22:22)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  }
  TaskScheduler::start(&local_b8);
  if (in_CL != '\0') {
    fputc(10,_stderr);
  }
  TaskScheduler::~TaskScheduler(&local_b8);
  return film;
}

Assistant:

Image Renderer::render(decltype(&Renderer::radiance) func, bool reportProgress) {
	Image film(camera->resx, camera->resy);
	auto gfunc = std::bind(func, this, std::placeholders::_1, std::placeholders::_2);
	TaskScheduler tasks;
	for (int y=0; y<camera->resy; ++y) {
		tasks.add([&,y](){
			for (int x=0; x<camera->resx; ++x) {
				vec2f pixelsize = vec2f(1.0/camera->resx, 1.0/camera->resy);
				vec2f pixelpos = vec2f(x,y) * pixelsize;
				film.setPixel(x, y, renderPixel(gfunc, pixelpos, pixelsize));
			}
		});
	}
	if (reportProgress) {
		tasks.onprogress = [](int k, int n){
			fprintf(stderr, "\r    %.1f%% ", 100.0f*k/n);
		};
	}
	tasks.start();
	if (reportProgress) {
		fprintf(stderr, "\n"); // new line after progress
	}
	return film;
}